

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-immediate.c
# Opt level: O3

int run_test_udp_send_immediate(void)

{
  int iVar1;
  int extraout_EAX;
  int iVar2;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_loop_t *puVar3;
  bool bVar4;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv_loop_t *unaff_RBX;
  undefined1 *puVar6;
  uv__queue *puVar7;
  void *__s2;
  uv_udp_t *puVar8;
  uv_handle_t *handle;
  sockaddr *in_R8;
  int64_t eval_b_6;
  int64_t eval_b_7;
  sockaddr_in addr;
  uv_udp_send_t req2;
  uv_udp_send_t req1;
  undefined1 auStack_328 [64];
  undefined1 auStack_2d8 [16];
  undefined1 local_2c8 [32];
  uv_buf_t local_2a8;
  uv_udp_send_t local_298;
  uv_udp_send_t local_150;
  long lVar5;
  
  puVar8 = (uv_udp_t *)local_2c8;
  auStack_2d8._8_8_ = 0x1dde06;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)(local_2c8 + 0x10));
  local_150.data = (void *)(long)iVar1;
  local_298.data = (uv_handle_t *)0x0;
  if (local_150.data == (void *)0x0) {
    auStack_2d8._8_8_ = 0x1dde31;
    puVar3 = uv_default_loop();
    auStack_2d8._8_8_ = 0x1dde40;
    iVar1 = uv_udp_init(puVar3,&server);
    local_150.data = (void *)(long)iVar1;
    local_298.data = (uv_handle_t *)0x0;
    if (local_150.data != (void *)0x0) goto LAB_001de100;
    auStack_2d8._8_8_ = 0x1dde79;
    iVar1 = uv_udp_bind(&server,(sockaddr *)(local_2c8 + 0x10),0);
    local_150.data = (void *)(long)iVar1;
    local_298.data = (uv_handle_t *)0x0;
    if (local_150.data != (void *)0x0) goto LAB_001de112;
    auStack_2d8._8_8_ = 0x1ddeb9;
    iVar1 = uv_udp_recv_start(&server,alloc_cb,sv_recv_cb);
    local_150.data = (void *)(long)iVar1;
    local_298.data = (uv_handle_t *)0x0;
    if (local_150.data != (void *)0x0) goto LAB_001de124;
    auStack_2d8._8_8_ = 0x1ddef5;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)(local_2c8 + 0x10));
    local_150.data = (void *)(long)iVar1;
    local_298.data = (uv_handle_t *)0x0;
    if (local_150.data != (void *)0x0) goto LAB_001de136;
    auStack_2d8._8_8_ = 0x1ddf20;
    puVar3 = uv_default_loop();
    auStack_2d8._8_8_ = 0x1ddf2f;
    iVar1 = uv_udp_init(puVar3,&client);
    local_150.data = (void *)(long)iVar1;
    local_298.data = (uv_handle_t *)0x0;
    if (local_150.data != (void *)0x0) goto LAB_001de148;
    auStack_2d8._8_8_ = 0x1ddf66;
    local_2a8 = uv_buf_init("PING",4);
    in_R8 = (sockaddr *)(local_2c8 + 0x10);
    auStack_2d8._8_8_ = 0x1ddf9a;
    iVar1 = uv_udp_send(&local_150,&client,&local_2a8,1,in_R8,cl_send_cb);
    local_298.data = (void *)(long)iVar1;
    local_2c8._0_8_ = (uv_loop_t *)0x0;
    if ((uv_handle_t *)local_298.data != (uv_handle_t *)0x0) goto LAB_001de15a;
    auStack_2d8._8_8_ = 0x1ddfc9;
    local_2a8 = uv_buf_init("PANG",4);
    in_R8 = (sockaddr *)(local_2c8 + 0x10);
    auStack_2d8._8_8_ = 0x1ddffa;
    iVar1 = uv_udp_send(&local_298,&client,&local_2a8,1,in_R8,cl_send_cb);
    local_2c8._0_8_ = SEXT48(iVar1);
    local_2c8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_2c8._0_8_ != (uv_loop_t *)0x0) goto LAB_001de167;
    auStack_2d8._8_8_ = 0x1de01d;
    puVar3 = uv_default_loop();
    auStack_2d8._8_8_ = 0x1de027;
    uv_run(puVar3,UV_RUN_DEFAULT);
    local_2c8._0_8_ = (uv_loop_t *)0x2;
    local_2c8._8_8_ = SEXT48(cl_send_cb_called);
    if ((uv_loop_t *)local_2c8._8_8_ != (uv_loop_t *)0x2) goto LAB_001de174;
    local_2c8._0_8_ = (uv_loop_t *)0x2;
    local_2c8._8_8_ = SEXT48(sv_recv_cb_called);
    if ((uv_loop_t *)local_2c8._8_8_ != (uv_loop_t *)0x2) goto LAB_001de181;
    local_2c8._0_8_ = (uv_loop_t *)0x2;
    local_2c8._8_8_ = SEXT48(close_cb_called);
    if ((uv_loop_t *)local_2c8._8_8_ != (uv_loop_t *)0x2) goto LAB_001de18e;
    auStack_2d8._8_8_ = 0x1de095;
    unaff_RBX = uv_default_loop();
    auStack_2d8._8_8_ = 0x1de0a9;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    auStack_2d8._8_8_ = 0x1de0b3;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_2c8._0_8_ = (uv_loop_t *)0x0;
    auStack_2d8._8_8_ = 0x1de0c0;
    puVar3 = uv_default_loop();
    auStack_2d8._8_8_ = 0x1de0c8;
    iVar1 = uv_loop_close(puVar3);
    local_2c8._8_8_ = SEXT48(iVar1);
    if (local_2c8._0_8_ == local_2c8._8_8_) {
      auStack_2d8._8_8_ = 0x1de0e3;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_2d8._8_8_ = 0x1de100;
    run_test_udp_send_immediate_cold_1();
LAB_001de100:
    auStack_2d8._8_8_ = 0x1de112;
    run_test_udp_send_immediate_cold_2();
LAB_001de112:
    auStack_2d8._8_8_ = 0x1de124;
    run_test_udp_send_immediate_cold_3();
LAB_001de124:
    auStack_2d8._8_8_ = 0x1de136;
    run_test_udp_send_immediate_cold_4();
LAB_001de136:
    auStack_2d8._8_8_ = 0x1de148;
    run_test_udp_send_immediate_cold_5();
LAB_001de148:
    auStack_2d8._8_8_ = 0x1de15a;
    run_test_udp_send_immediate_cold_6();
LAB_001de15a:
    auStack_2d8._8_8_ = 0x1de167;
    run_test_udp_send_immediate_cold_7();
LAB_001de167:
    auStack_2d8._8_8_ = 0x1de174;
    run_test_udp_send_immediate_cold_8();
LAB_001de174:
    auStack_2d8._8_8_ = 0x1de181;
    run_test_udp_send_immediate_cold_9();
LAB_001de181:
    auStack_2d8._8_8_ = 0x1de18e;
    run_test_udp_send_immediate_cold_10();
LAB_001de18e:
    auStack_2d8._8_8_ = 0x1de19b;
    run_test_udp_send_immediate_cold_11();
  }
  puVar6 = local_2c8 + 8;
  auStack_2d8._8_8_ = alloc_cb;
  run_test_udp_send_immediate_cold_12();
  bVar4 = puVar8 == &client || puVar8 == &server;
  lVar5 = CONCAT71(0x1028e,bVar4);
  auStack_2d8._8_8_ = ZEXT18(bVar4);
  auStack_2d8._0_8_ = 0;
  if ((undefined1 *)auStack_2d8._8_8_ == (undefined1 *)0x0) {
    alloc_cb_cold_2();
  }
  else {
    auStack_2d8._0_8_ = 0x10000;
    auStack_2d8._8_8_ = puVar6;
    if ((long)puVar6 < 0x10001) {
      *extraout_RDX = alloc_cb::slab;
      extraout_RDX[1] = 0x10000;
      return 0x1028ed0;
    }
  }
  puVar8 = (uv_udp_t *)(auStack_2d8 + 8);
  puVar7 = (uv__queue *)auStack_2d8;
  alloc_cb_cold_1();
  auStack_328._56_8_ = unaff_RBX;
  if ((long)puVar7 < 0) {
    auStack_328._24_8_ = (uv_close_cb)0x1de359;
    sv_recv_cb_cold_7();
LAB_001de359:
    auStack_328._24_8_ = (uv_close_cb)0x1de368;
    sv_recv_cb_cold_5();
LAB_001de368:
    auStack_328._24_8_ = (uv_close_cb)0x1de377;
    sv_recv_cb_cold_1();
LAB_001de377:
    auStack_328._24_8_ = (uv_close_cb)0x1de37c;
    sv_recv_cb_cold_4();
LAB_001de37c:
    iVar1 = (int)auStack_328 + 0x28;
    auStack_328._24_8_ = (uv_close_cb)0x1de38b;
    sv_recv_cb_cold_2();
LAB_001de38b:
    auStack_328._24_8_ = (uv_close_cb)0x1de390;
    sv_recv_cb_cold_3();
  }
  else {
    if (puVar7 != (uv__queue *)0x0) {
      auStack_328._48_8_ = ZEXT18(puVar8 == &client || puVar8 == &server);
      auStack_328._40_8_ = (uv__queue *)0x0;
      if ((uv_handle_t *)auStack_328._48_8_ == (uv_handle_t *)0x0) goto LAB_001de359;
      auStack_328._48_8_ = (ulong)in_R8 & 0xffffffff;
      auStack_328._40_8_ = (uv__queue *)0x0;
      if ((uv_handle_t *)auStack_328._48_8_ != (uv_handle_t *)0x0) goto LAB_001de368;
      if (lVar5 == 0) goto LAB_001de377;
      auStack_328._48_8_ = (uv_handle_t *)0x4;
      auStack_328._40_8_ = puVar7;
      if (puVar7 != (uv__queue *)0x4) goto LAB_001de37c;
      __s2 = (void *)*extraout_RDX_00;
      auStack_328._24_8_ = (uv_close_cb)0x1de2ea;
      iVar1 = bcmp("PING",__s2,4);
      if (iVar1 == 0) {
LAB_001de308:
        sv_recv_cb_called = sv_recv_cb_called + 1;
        if (sv_recv_cb_called != 2) {
          return sv_recv_cb_called;
        }
        auStack_328._24_8_ = (uv_close_cb)0x1de331;
        uv_close((uv_handle_t *)&server,close_cb);
        uv_close((uv_handle_t *)&client,close_cb);
        return extraout_EAX_00;
      }
      auStack_328._24_8_ = (uv_close_cb)0x1de300;
      iVar2 = bcmp("PANG",__s2,4);
      iVar1 = (int)__s2;
      if (iVar2 == 0) goto LAB_001de308;
      goto LAB_001de38b;
    }
    iVar1 = 0;
    if (lVar5 == 0) {
      return extraout_EAX;
    }
  }
  auStack_328._24_8_ = cl_send_cb;
  sv_recv_cb_cold_6();
  if (lVar5 == 0) {
    auStack_328._0_8_ = (void *)0x1de40b;
    cl_send_cb_cold_3();
  }
  else {
    auStack_328._24_8_ = SEXT48(iVar1);
    auStack_328._16_8_ = 0;
    if ((uv_close_cb)auStack_328._24_8_ == (uv_close_cb)0x0) {
      bVar4 = *(uv_udp_t **)(lVar5 + 0x48) == &client || *(uv_udp_t **)(lVar5 + 0x48) == &server;
      auStack_328._24_8_ = ZEXT18(bVar4);
      auStack_328._16_8_ = 0;
      if ((uv_close_cb)auStack_328._24_8_ != (uv_close_cb)0x0) {
        cl_send_cb_called = cl_send_cb_called + 1;
        return (int)bVar4;
      }
      goto LAB_001de41a;
    }
  }
  auStack_328._0_8_ = (void *)0x1de41a;
  cl_send_cb_cold_1();
LAB_001de41a:
  puVar8 = (uv_udp_t *)(auStack_328 + 0x18);
  auStack_328._0_8_ = close_cb;
  cl_send_cb_cold_2();
  auStack_328._0_8_ = ZEXT18(puVar8 == &client || puVar8 == &server);
  if ((void *)auStack_328._0_8_ == (void *)0x0) {
    close_cb_cold_2();
  }
  else {
    auStack_328._0_8_ = (void *)0x1;
    iVar1 = uv_is_closing((uv_handle_t *)puVar8);
    if ((void *)auStack_328._0_8_ == (void *)(long)iVar1) {
      close_cb_called = close_cb_called + 1;
      return (int)auStack_328._0_8_;
    }
  }
  handle = (uv_handle_t *)auStack_328;
  close_cb_cold_1();
  iVar1 = uv_is_closing(handle);
  if (iVar1 == 0) {
    uv_close(handle,(uv_close_cb)0x0);
    return extraout_EAX_01;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(udp_send_immediate) {
  struct sockaddr_in addr;
  uv_udp_send_t req1, req2;
  uv_buf_t buf;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_udp_recv_start(&server, alloc_cb, sv_recv_cb);
  ASSERT_OK(r);

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  /* client sends "PING", then "PANG" */
  buf = uv_buf_init("PING", 4);

  r = uv_udp_send(&req1,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  cl_send_cb);
  ASSERT_OK(r);

  buf = uv_buf_init("PANG", 4);

  r = uv_udp_send(&req2,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  cl_send_cb);
  ASSERT_OK(r);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(2, cl_send_cb_called);
  ASSERT_EQ(2, sv_recv_cb_called);
  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}